

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O2

bool __thiscall NaVector::operator==(NaVector *this,NaVector *rVect)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  
  iVar1 = (*this->_vptr_NaVector[6])();
  iVar2 = (*rVect->_vptr_NaVector[6])(rVect);
  uVar4 = 0;
  bVar5 = false;
  if (iVar1 == iVar2) {
    while( true ) {
      uVar3 = (*this->_vptr_NaVector[6])(this);
      bVar5 = uVar3 <= uVar4;
      if (bVar5) break;
      (*this->_vptr_NaVector[9])(this,(ulong)uVar4);
      (*rVect->_vptr_NaVector[9])(rVect,(ulong)uVar4);
      uVar4 = uVar4 + 1;
      if (extraout_XMM0_Qa != extraout_XMM0_Qa_00) {
        return bVar5;
      }
      if (NAN(extraout_XMM0_Qa) || NAN(extraout_XMM0_Qa_00)) {
        return bVar5;
      }
    }
  }
  return bVar5;
}

Assistant:

bool
NaVector::operator== (const NaVector& rVect) const
{
  unsigned	i;
  if(dim() != rVect.dim())
    return false;
  for(i = 0; i < dim(); ++i)
    if(get(i) != rVect.get(i))
      return false;
  return true;
}